

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O1

void __thiscall
helics::apps::WebServer::startServer
          (WebServer *this,json *val,shared_ptr<helics::apps::TypedBrokerServer> *ptr)

{
  byte bVar1;
  element_type *peVar2;
  __time_t _Var3;
  int iVar4;
  json *pjVar5;
  long lVar6;
  int *piVar7;
  invalid_argument *this_00;
  pointer *__ptr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  bool bVar9;
  string_view message;
  timespec local_38;
  thread local_28;
  
  message._M_str = "starting broker web server";
  message._M_len = 0x1a;
  TypedBrokerServer::logMessage(message);
  pjVar5 = &null_abi_cxx11_;
  if (val != (json *)0x0) {
    pjVar5 = val;
  }
  this->config = pjVar5;
  LOCK();
  bVar9 = (this->running)._M_base._M_i == false;
  if (bVar9) {
    (this->running)._M_base._M_i = true;
  }
  UNLOCK();
  if (bVar9) {
    local_38.tv_sec = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<helics::apps::IocWrapper,std::allocator<helics::apps::IocWrapper>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38.tv_nsec,
               (IocWrapper **)&local_38,(allocator<helics::apps::IocWrapper> *)&local_28);
    lVar6 = local_38.tv_nsec;
    _Var3 = local_38.tv_sec;
    local_38.tv_sec = 0;
    local_38.tv_nsec = 0;
    p_Var8 = (this->context).
             super___shared_ptr<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->context).super___shared_ptr<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)_Var3;
    (this->context).super___shared_ptr<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)lVar6;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.tv_nsec !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.tv_nsec);
    }
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->threadGuard);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    peVar2 = (ptr->super___shared_ptr<helics::apps::TypedBrokerServer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if (peVar2 == (element_type *)0x0) {
      lVar6 = 0;
    }
    else {
      lVar6 = __dynamic_cast(peVar2,&TypedBrokerServer::typeinfo,&typeinfo,0);
    }
    if (lVar6 == 0) {
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      lVar6 = 0;
    }
    else {
      p_Var8 = (ptr->super___shared_ptr<helics::apps::TypedBrokerServer,_(__gnu_cxx::_Lock_policy)2>
               )._M_refcount._M_pi;
      if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        }
      }
    }
    if (lVar6 == 0) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_00,"pointer to a webserver required for operation");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    local_28._M_id._M_thread = (id)0;
    local_38.tv_sec = (__time_t)operator_new(0x20);
    *(undefined ***)local_38.tv_sec = &PTR___State_impl_0055a888;
    *(WebServer **)(local_38.tv_sec + 8) = this;
    *(long *)(local_38.tv_sec + 0x10) = lVar6;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_38.tv_sec + 0x18) = p_Var8;
    std::thread::_M_start_thread(&local_28,&local_38,0);
    if ((long *)local_38.tv_sec != (long *)0x0) {
      (**(code **)(*(long *)local_38.tv_sec + 8))();
    }
    if ((this->mainLoopThread)._M_id._M_thread != 0) {
      std::terminate();
    }
    (this->mainLoopThread)._M_id._M_thread = (native_handle_type)local_28._M_id._M_thread;
    std::thread::detach();
    sched_yield();
    bVar1 = (this->executing)._M_base._M_i;
    while ((bVar1 & 1) == 0) {
      local_38.tv_sec = 0;
      local_38.tv_nsec = 50000000;
      do {
        iVar4 = nanosleep(&local_38,&local_38);
        if (iVar4 != -1) break;
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      bVar1 = (this->executing)._M_base._M_i;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->threadGuard);
  }
  return;
}

Assistant:

void WebServer::startServer(const nlohmann::json* val,
                            const std::shared_ptr<TypedBrokerServer>& ptr)
{
    logMessage("starting broker web server");
    config = (val != nullptr) ? val : &null;
    bool exp{false};
    if (running.compare_exchange_strong(exp, true)) {
        // The io_context is required for all I/O
        context = std::make_shared<IocWrapper>();

        const std::lock_guard<std::mutex> tlock(threadGuard);

        auto webptr = std::dynamic_pointer_cast<WebServer>(ptr);
        if (!webptr) {
            throw(std::invalid_argument("pointer to a webserver required for operation"));
        }
        mainLoopThread = std::thread([this, webptr = std::move(webptr)]() { mainLoop(webptr); });
        mainLoopThread.detach();
        std::this_thread::yield();
        while (!executing) {
            std::this_thread::sleep_for(std::chrono::milliseconds(50));
        }
    }
}